

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack20(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[1];
  *out = (uint)uVar1 << 0x14 | (uint)*in & 0xfffff;
  out[1] = ((uint)in[2] & 0xfffff) << 8 | (uint)uVar1 >> 0xc & 0xff;
  Unroller<(unsigned_short)20,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack20(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<20>::Pack(in, out);
}